

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftext.c
# Opt level: O0

void rffts(float *data,long M,long Rows)

{
  short *in_RSI;
  float *in_RDI;
  long unaff_retaddr;
  long in_stack_00000008;
  
  rffts1((float *)Rows,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI);
  return;
}

Assistant:

void rffts(float *data, long M, long Rows){
/* Compute in-place real fft on the rows of the input array	*/
/* The result is the complex spectra of the positive frequencies */
/* except the location for the first complex number contains the real */
/* values for DC and Nyquest */
/* See rspectprod for multiplying two of these spectra together- ex. for fast convolution */
/* INPUTS */
/* *ioptr = real input data array	*/
/* M = log2 of fft size	(ex M=10 for 1024 point fft) */
/* Rows = number of rows in ioptr array (use 1 for Rows for a single fft)	*/
/* OUTPUTS */
/* *ioptr = output data array	in the following order */
/* Re(x[0]), Re(x[N/2]), Re(x[1]), Im(x[1]), Re(x[2]), Im(x[2]), ... Re(x[N/2-1]), Im(x[N/2-1]). */
	rffts1(data, M, Rows, UtblArray[M], BRLowArray[(M-1)/2]);
}